

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::PrintStatementSourceLine(FunctionBody *this,uint statementIndex)

{
  bool bVar1;
  uint cchStartOffset;
  Utf8SourceInfo *this_00;
  uint startOffset;
  uint statementIndex_local;
  FunctionBody *this_local;
  
  if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 0xb & 1) ==
      0) {
    this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
    bVar1 = Utf8SourceInfo::GetIsLibraryCode(this_00);
    if ((!bVar1) &&
       ((cchStartOffset = GetStatementStartOffset(this,statementIndex), cchStartOffset != 0 ||
        (statementIndex == 0)))) {
      PrintStatementSourceLineFromStartOffset(this,cchStartOffset);
    }
  }
  return;
}

Assistant:

void FunctionBody::PrintStatementSourceLine(uint statementIndex)
    {
        if (m_isWasmFunction || this->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // currently no source view support for wasm
            return;
        }

        const uint startOffset = GetStatementStartOffset(statementIndex);

        // startOffset should only be 0 if statementIndex is 0, otherwise it is EOF and we should skip printing anything
        if (startOffset != 0 || statementIndex == 0)
        {
            PrintStatementSourceLineFromStartOffset(startOffset);
        }
    }